

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall
llm_tokenizer_bpe_session::tokenize
          (llm_tokenizer_bpe_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  vector<llm_symbol,_std::allocator<llm_symbol>_> *this_00;
  llm_symbol *plVar1;
  index iVar2;
  bool bVar3;
  llama_token lVar4;
  size_t sVar5;
  pointer plVar6;
  llm_symbol *sym_1;
  ulong uVar7;
  llm_symbol *__args;
  pointer text_00;
  ulong uVar8;
  pointer plVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  llm_symbol sym;
  string left_token;
  string right_token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  word_collection;
  llama_token token_multibyte;
  
  unicode_regex_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&word_collection,(string *)text,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->tokenizer->regex_exprs);
  plVar6 = (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar6) {
    (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar6;
  }
  this_00 = &this->symbols;
  iVar11 = -1;
  for (text_00 = word_collection.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      text_00 !=
      word_collection.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; text_00 = (pointer)((string *)text_00 + 1)) {
    sym.n = 0;
    sym.prev = 0;
    sym.next = 0;
    sym.text = (char *)0x0;
    llama_vocab::std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>::_M_move_assign
              ((vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_> *)&this->work_queue,&sym);
    llama_vocab::std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>::~vector
              ((vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_> *)&sym);
    plVar6 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
        super__Vector_impl_data._M_finish != plVar6) {
      (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
      super__Vector_impl_data._M_finish = plVar6;
    }
    if ((((this->vocab->pimpl)._M_t.
          super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
          super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
          super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl)->ignore_merges == true) &&
       (lVar4 = llama_vocab::text_to_token(this->vocab,(string *)text_00), lVar4 != -1)) {
      sym.prev = -1;
      sym.next = -1;
      sym.text = (((string *)text_00)->_M_dataplus)._M_p;
      sym.n = ((string *)text_00)->_M_string_length;
      llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::emplace_back<llm_symbol>
                (this_00,&sym);
      uVar7 = ((string *)text_00)->_M_string_length;
    }
    else {
      uVar7 = 0;
    }
    iVar10 = -1;
    while (uVar8 = ((string *)text_00)->_M_string_length - uVar7,
          uVar7 <= ((string *)text_00)->_M_string_length && uVar8 != 0) {
      sVar5 = unicode_len_utf8((((string *)text_00)->_M_dataplus)._M_p[uVar7]);
      sym.n = uVar8;
      if (sVar5 < uVar8) {
        sym.n = sVar5;
      }
      sym.text = (((string *)text_00)->_M_dataplus)._M_p + uVar7;
      uVar7 = uVar7 + sym.n;
      sym.next = iVar10 + 2;
      if (uVar7 == ((string *)text_00)->_M_string_length) {
        sym.next = -1;
      }
      sym.prev = iVar10;
      std::vector<llm_symbol,std::allocator<llm_symbol>>::emplace_back<llm_symbol&>
                ((vector<llm_symbol,std::allocator<llm_symbol>> *)this_00,&sym);
      iVar10 = iVar10 + 1;
    }
    for (iVar10 = 1;
        iVar10 < (int)(((long)(this->symbols).
                              super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->symbols).
                             super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x18); iVar10 = iVar10 + 1) {
      add_new_bigram(this,iVar10 + -1,iVar10);
    }
    while ((this->work_queue).
           super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
           .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->work_queue).
           super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
           .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      ::pop_move((llm_bigram_bpe *)&sym,&this->work_queue);
      plVar6 = (this_00->super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (plVar6[sym.prev].n != 0) {
        iVar2 = sym.next;
        if (plVar6[sym.next].n != 0) {
          plVar9 = plVar6 + sym.prev;
          left_token._M_dataplus._M_p = (pointer)&left_token.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&left_token,plVar9->text,plVar9->text + plVar6[sym.prev].n);
          right_token._M_dataplus._M_p = (pointer)&right_token.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&right_token,plVar6[iVar2].text,plVar6[iVar2].text + plVar6[iVar2].n)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &token_multibyte,&left_token,&right_token);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&token_multibyte,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&sym.text);
          std::__cxx11::string::~string((string *)&token_multibyte);
          if (!bVar3) {
            plVar9->n = plVar9->n + plVar6[iVar2].n;
            plVar6[iVar2].n = 0;
            iVar10 = plVar6[iVar2].next;
            plVar9->next = iVar10;
            if (-1 < (long)iVar10) {
              (this_00->super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar10].prev = sym.prev;
            }
            add_new_bigram(this,plVar9->prev,sym.prev);
            add_new_bigram(this,sym.prev,plVar9->next);
          }
          std::__cxx11::string::~string((string *)&right_token);
          std::__cxx11::string::~string((string *)&left_token);
        }
      }
      std::__cxx11::string::~string((string *)&sym.text);
    }
    plVar1 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__args = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                  _M_impl.super__Vector_impl_data._M_start; __args != plVar1; __args = __args + 1) {
      if (__args->n != 0) {
        __args->prev = iVar11;
        __args->next = -1;
        if (iVar11 != -1) {
          plVar6 = (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          plVar6[iVar11].next =
               (index)(((long)(this->symbols_final).
                              super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)plVar6) / 0x18);
        }
        std::vector<llm_symbol,std::allocator<llm_symbol>>::emplace_back<llm_symbol&>
                  ((vector<llm_symbol,std::allocator<llm_symbol>> *)&this->symbols_final,__args);
        iVar11 = (int)(((long)(this->symbols_final).
                              super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->symbols_final).
                             super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x18) + -1;
      }
    }
  }
  llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator=
            (this_00,&this->symbols_final);
  plVar6 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar6 != (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    for (iVar11 = 0; iVar11 != -1; iVar11 = plVar6[iVar11].next) {
      if (plVar6[iVar11].n != 0) {
        sym._0_8_ = &sym.n;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sym,plVar6[iVar11].text,plVar6[iVar11].text + plVar6[iVar11].n);
        lVar4 = llama_vocab::text_to_token(this->vocab,(string *)&sym);
        right_token._M_dataplus._M_p._0_4_ = lVar4;
        pcVar12 = (char *)sym._0_8_;
        if (lVar4 == -1) {
          for (; pcVar12 != sym.text + sym._0_8_; pcVar12 = pcVar12 + 1) {
            left_token._M_dataplus._M_p = (pointer)&left_token.field_2;
            std::__cxx11::string::_M_construct((ulong)&left_token,'\x01');
            token_multibyte = llama_vocab::text_to_token(this->vocab,&left_token);
            if (token_multibyte != -1) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)output,&token_multibyte);
            }
            std::__cxx11::string::~string((string *)&left_token);
          }
        }
        else {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)output,
                     (value_type_conflict3 *)&right_token);
        }
        std::__cxx11::string::~string((string *)&sym);
        plVar6 = (this_00->super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&word_collection);
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        int final_prev_index = -1;
        const auto word_collection = unicode_regex_split(text, tokenizer.regex_exprs);

        symbols_final.clear();

        for (const auto & word : word_collection) {
            work_queue = llm_bigram_bpe::queue();
            symbols.clear();

            int index = 0;
            size_t offset = 0;

            //if (vocab.tokenizer_ignore_merges && vocab.token_to_id.find(word) != vocab.token_to_id.end()) {
            if (vocab.get_ignore_merges() && vocab.text_to_token(word) != LLAMA_TOKEN_NULL) {
                symbols.emplace_back(llm_symbol{-1, -1, word.c_str(), word.size()});
                offset = word.size();
            }

            while (offset < word.size()) {
                llm_symbol sym;
                size_t char_len = std::min(word.size() - offset, (size_t) unicode_len_utf8(word[offset]));
                sym.text = word.c_str() + offset;
                sym.n = char_len;
                offset += sym.n;
                sym.prev = index - 1;
                sym.next = offset == word.size() ? -1 : index + 1;
                index++;
                symbols.emplace_back(sym);
            }
            for (int i = 1; i < (int) symbols.size(); ++i) {
                add_new_bigram(i - 1, i);
            }

            // build token(s)
            while (!work_queue.empty()) {
                auto bigram = work_queue.pop_move();

                auto & left_symbol = symbols[bigram.left];
                auto & right_symbol = symbols[bigram.right];

                if (left_symbol.n == 0 || right_symbol.n == 0) {
                    continue;
                }
                std::string left_token = std::string(left_symbol.text, left_symbol.n);
                std::string right_token = std::string(right_symbol.text, right_symbol.n);
                if (left_token + right_token != bigram.text) {
                    continue;  // Skip this bigram if it's outdated
                }

                // merge the right sym into the left one
                left_symbol.n += right_symbol.n;
                right_symbol.n = 0;

                // remove the right sym from the chain
                left_symbol.next = right_symbol.next;
                if (right_symbol.next >= 0) {
                    symbols[right_symbol.next].prev = bigram.left;
                }

                add_new_bigram(left_symbol.prev, bigram.left);  // left side of current symbol
                add_new_bigram(bigram.left, left_symbol.next);  // right side of current symbol
            }

            // add the finished tokens to the final list keeping correct order for next and prev
            for (auto & sym : symbols) {
                if (sym.n > 0) {
                    sym.prev = final_prev_index;
                    sym.next = -1;
                    if (final_prev_index != -1) {
                        symbols_final[final_prev_index].next = symbols_final.size();
                    }
                    symbols_final.emplace_back(sym);
                    final_prev_index = symbols_final.size() - 1;
                }
            }
        }

        symbols = symbols_final;

        if (!symbols.empty()) {
            for (int i = 0; i != -1; i = symbols[i].next) {
                auto & symbol = symbols[i];
                if (symbol.n == 0) {
                    continue;
                }

                const std::string str = std::string(symbol.text, symbol.n);
                const auto token = vocab.text_to_token(str);

                if (token == LLAMA_TOKEN_NULL) {
                    for (auto j = str.begin(); j != str.end(); ++j) {
                        std::string byte_str(1, *j);
                        auto token_multibyte = vocab.text_to_token(byte_str);
                        if (token_multibyte != LLAMA_TOKEN_NULL) {
                            output.push_back(token_multibyte);
                        }
                    }
                } else {
                    output.push_back(token);
                }
            }
        }
    }